

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_xmi_midiout.cpp
# Opt level: O1

void __thiscall XMISong::ProcessInitialMetaEvents(XMISong *this)

{
  byte *pbVar1;
  BYTE BVar2;
  TrackInfo *pTVar3;
  ulong uVar4;
  BYTE *pBVar5;
  byte bVar6;
  size_t sVar7;
  size_t sVar8;
  uint uVar9;
  
  pTVar3 = this->CurrSong;
  bVar6 = pTVar3->Finished;
  if ((bVar6 & 1) == 0) {
    uVar4 = pTVar3->EventLen;
    sVar8 = pTVar3->EventP;
    do {
      if ((uVar4 - 3 <= sVar8) || (pBVar5 = pTVar3->EventChunk, pBVar5[sVar8] != 0xff)) break;
      BVar2 = pBVar5[sVar8 + 1];
      pTVar3->EventP = sVar8 + 2;
      uVar9 = 0;
      sVar7 = sVar8 + 2;
      do {
        sVar8 = sVar7;
        if (uVar4 <= sVar7) break;
        sVar8 = sVar7 + 1;
        pTVar3->EventP = sVar8;
        pbVar1 = pBVar5 + sVar7;
        uVar9 = uVar9 << 7 | *pbVar1 & 0x7f;
        sVar7 = sVar8;
      } while ((char)*pbVar1 < '\0');
      sVar8 = uVar9 + sVar8;
      if ((sVar8 <= uVar4) && (BVar2 == '/')) {
        pTVar3->Finished = true;
        bVar6 = 1;
      }
      pTVar3->EventP = sVar8;
    } while ((bVar6 & 1) == 0);
  }
  if (pTVar3->EventLen - 1 <= pTVar3->EventP) {
    pTVar3->Finished = true;
  }
  return;
}

Assistant:

void XMISong::ProcessInitialMetaEvents ()
{
	TrackInfo *track = CurrSong;
	BYTE event;
	DWORD len;

	while (!track->Finished &&
			track->EventP < track->EventLen - 3 &&
			track->EventChunk[track->EventP] == MIDI_META)
	{
		event = track->EventChunk[track->EventP+1];
		track->EventP += 2;
		len = track->ReadVarLen();
		if (track->EventP + len <= track->EventLen && event == MIDI_META_EOT)
		{
			track->Finished = true;
		}
		track->EventP += len;
	}
	if (track->EventP >= track->EventLen - 1)
	{
		track->Finished = true;
	}
}